

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpromisefuture.h
# Opt level: O1

void QtPromisePrivate::PromiseFulfill<QFuture<void>_>::call
               (QFuture<void> *future,QPromiseResolve<void> *resolve,QPromiseReject<void> *reject)

{
  Data *pDVar1;
  Data *pDVar2;
  QFutureWatcher<void> *this;
  Object local_28 [8];
  
  this = (QFutureWatcher<void> *)operator_new(0x20);
  QFutureWatcher<void>::QFutureWatcher(this,(QObject *)0x0);
  pDVar1 = (reject->m_resolver).m_d.d;
  if (pDVar1 != (Data *)0x0) {
    LOCK();
    (pDVar1->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value = (Type)((int)(pDVar1->super_QSharedData).ref.super_QAtomicInteger<int>.
                           super_QBasicAtomicInteger<int>._q_value + 1);
    UNLOCK();
  }
  pDVar2 = (resolve->m_resolver).m_d.d;
  if (pDVar2 != (Data *)0x0) {
    LOCK();
    (pDVar2->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value = (Type)((int)(pDVar2->super_QSharedData).ref.super_QAtomicInteger<int>.
                           super_QBasicAtomicInteger<int>._q_value + 1);
    UNLOCK();
  }
  QObject::
  connect<void(QFutureWatcherBase::*)(),QtPromisePrivate::PromiseFulfill<QFuture<void>>::call(QFuture<void>const&,QtPromise::QPromiseResolve<void>const&,QtPromise::QPromiseReject<void>const&)::_lambda()_1_>
            (local_28,(offset_in_QFutureWatcherBase_to_subr)this,
             (anon_class_24_3_24552672_for_function *)QFutureWatcherBase::finished);
  QMetaObject::Connection::~Connection((Connection *)local_28);
  if (pDVar2 != (Data *)0x0) {
    LOCK();
    (pDVar2->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value = (Type)((int)(pDVar2->super_QSharedData).ref.super_QAtomicInteger<int>.
                           super_QBasicAtomicInteger<int>._q_value + -1);
    UNLOCK();
    if (((__atomic_base<int>)
         *(__int_type *)
          &(pDVar2->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
           _q_value == (__atomic_base<int>)0x0) && (pDVar2 != (Data *)0x0)) {
      operator_delete(pDVar2,0x10);
    }
  }
  if (pDVar1 != (Data *)0x0) {
    LOCK();
    (pDVar1->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value = (Type)((int)(pDVar1->super_QSharedData).ref.super_QAtomicInteger<int>.
                           super_QBasicAtomicInteger<int>._q_value + -1);
    UNLOCK();
    if (((__atomic_base<int>)
         *(__int_type *)
          &(pDVar1->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
           _q_value == (__atomic_base<int>)0x0) && (pDVar1 != (Data *)0x0)) {
      operator_delete(pDVar1,0x10);
    }
  }
  if (*(long *)&future->field_0x8 != *(long *)&(this->m_future).field_0x8) {
    QFutureWatcherBase::disconnectOutputInterface(SUB81(this,0));
    QFutureInterfaceBase::operator=(&(this->m_future).d,&future->d);
    QFutureWatcherBase::connectOutputInterface();
  }
  return;
}

Assistant:

static void call(const QFuture<void>& future,
                     const QtPromise::QPromiseResolve<void>& resolve,
                     const QtPromise::QPromiseReject<void>& reject)
    {
        using Watcher = QFutureWatcher<void>;

        Watcher* watcher = new Watcher{};
        QObject::connect(watcher, &Watcher::finished, [=]() mutable {
            try {
                if (watcher->isCanceled()) {
                    // let's rethrown potential exception
                    watcher->waitForFinished();
                    reject(QtPromise::QPromiseCanceledException{});
                } else {
                    resolve();
                }
            } catch (...) {
                reject(std::current_exception());
            }

            watcher->deleteLater();
        });

        watcher->setFuture(future);
    }